

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_readlink(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  char *__path;
  ssize_t sVar1;
  ssize_t res;
  int err;
  char buf [4096];
  char *path;
  undefined8 in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefb0;
  undefined4 in_stack_ffffffffffffefb4;
  char in_stack_ffffffffffffefb8;
  undefined7 in_stack_ffffffffffffefb9;
  undefined4 in_stack_ffffffffffffefc0;
  int in_stack_ffffffffffffefc4;
  char *in_stack_ffffffffffffefc8;
  JSContext *in_stack_ffffffffffffefd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  val1.tag._0_4_ = in_stack_ffffffffffffefb0;
  val1.u = (JSValueUnion)in_stack_ffffffffffffefa8;
  val1.tag._4_4_ = in_stack_ffffffffffffefb4;
  __path = JS_ToCString((JSContext *)0x1172ba,val1);
  if (__path == (char *)0x0) {
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    sVar1 = readlink(__path,&stack0xffffffffffffefb8,0xfff);
    if (sVar1 < 0) {
      in_stack_ffffffffffffefb8 = '\0';
      __errno_location();
    }
    else {
      (&stack0xffffffffffffefb8)[sVar1] = 0;
    }
    JS_FreeCString((JSContext *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                   (char *)CONCAT71(in_stack_ffffffffffffefb9,in_stack_ffffffffffffefb8));
    _local_10 = make_string_error(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
                                  in_stack_ffffffffffffefc4);
  }
  return _local_10;
}

Assistant:

static JSValue js_os_readlink(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    const char *path;
    char buf[PATH_MAX];
    int err;
    ssize_t res;
    
    path = JS_ToCString(ctx, argv[0]);
    if (!path)
        return JS_EXCEPTION;
    res = readlink(path, buf, sizeof(buf) - 1);
    if (res < 0) {
        buf[0] = '\0';
        err = errno;
    } else {
        buf[res] = '\0';
        err = 0;
    }
    JS_FreeCString(ctx, path);
    return make_string_error(ctx, buf, err);
}